

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O1

void __thiscall ProxyClient::ProxyClient(ProxyClient *this)

{
  uint8_t *puVar1;
  pointer *__ptr;
  
  *(undefined8 *)
   ((long)&(this->m_pipe)._M_t.
           super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
           super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
           super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_cypher)._M_t.super___uniq_ptr_impl<Cypher,_std::default_delete<Cypher>_>._M_t.
           super__Tuple_impl<0UL,_Cypher_*,_std::default_delete<Cypher>_>.
           super__Head_base<0UL,_Cypher_*,_false>._M_head_impl + 4) = 0;
  (this->m_tcpSvr)._M_t.
  super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>._M_t.
  super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>.
  super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl = (TCPServer *)0x0;
  (this->m_pipe)._M_t.super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>.
  _M_t.super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
  super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl = (Client *)0x0;
  (this->m_remoteIP)._M_dataplus._M_p = (pointer)&(this->m_remoteIP).field_2;
  (this->m_remoteIP)._M_string_length = 0;
  (this->m_remoteIP).field_2._M_local_buf[0] = '\0';
  (this->m_username)._M_dataplus._M_p = (pointer)&(this->m_username).field_2;
  (this->m_username)._M_string_length = 0;
  (this->m_username).field_2._M_local_buf[0] = '\0';
  (this->m_password)._M_dataplus._M_p = (pointer)&(this->m_password).field_2;
  (this->m_password)._M_string_length = 0;
  (this->m_password).field_2._M_local_buf[0] = '\0';
  this->m_recvBuffer = (char *)0x0;
  this->m_recvBufLen = 0;
  *(undefined8 *)&(this->m_stopCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_stopCall).super__Function_base._M_functor + 8) = 0;
  (this->m_stopCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_stopCall)._M_invoker = (_Invoker_type)0x0;
  net_uv::UVLoop::UVLoop(&this->m_loop);
  net_uv::UVTimer::UVTimer(&this->m_update);
  (this->m_sessionDataMap)._M_h._M_buckets = &(this->m_sessionDataMap)._M_h._M_single_bucket;
  (this->m_sessionDataMap)._M_h._M_bucket_count = 1;
  (this->m_sessionDataMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_sessionDataMap)._M_h._M_element_count = 0;
  (this->m_sessionDataMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_sessionDataMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_sessionDataMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (uint8_t *)malloc(0x40000);
  this->m_sendBuffer = puVar1;
  return;
}

Assistant:

ProxyClient::ProxyClient()
	: m_stopCall(nullptr)
	, m_runStatus(RUN_STATUS::STOP)
	, m_recvBuffer(NULL)
	, m_recvBufLen(0)
{
	m_sendBuffer = (uint8_t*)fc_malloc(MSG_MAX_SIZE);
}